

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::VertexAttributeCase::iterate(VertexAttributeCase *this)

{
  ostringstream *this_00;
  uint uVar1;
  uint uVar2;
  RenderContext *context;
  short sVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  deUint32 dVar8;
  long lVar9;
  pointer puVar10;
  undefined4 extraout_var;
  short sVar11;
  int x;
  long lVar12;
  char *description;
  int x_1;
  qpTestResult testResult;
  pointer puVar13;
  long lVar14;
  unsigned_short uVar15;
  uint *puVar16;
  unsigned_short uVar17;
  int y;
  long lVar18;
  float posX;
  float fVar19;
  float fVar20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
  gridAttributes;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  Surface resultImage;
  undefined1 local_1a0 [384];
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&gridVertices,0x1e4,(allocator_type *)local_1a0);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            (&gridAttributes,0x1e4,(allocator_type *)local_1a0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,0xa56,(allocator_type *)local_1a0);
  tcu::Surface::Surface(&resultImage,0x100,0x100);
  lVar9 = 2;
  for (lVar12 = 0; lVar12 != 0x16; lVar12 = lVar12 + 1) {
    fVar19 = (float)(int)lVar12 / 21.0;
    uVar1 = (&Stress::(anonymous_namespace)::s_specialFloats)[lVar12];
    puVar16 = &Stress::(anonymous_namespace)::s_specialFloats;
    lVar14 = lVar9;
    for (lVar18 = 0; lVar18 != 0x16; lVar18 = lVar18 + 1) {
      fVar20 = (float)(int)lVar18 / 21.0;
      (gridVertices.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start)->m_data[lVar14 + -2] = fVar19 + fVar19 + -1.0;
      (gridVertices.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start)->m_data[lVar14 + -1] = fVar20 + fVar20 + -1.0;
      ((gridVertices.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start)->m_data + lVar14)[0] = 0.0;
      ((gridVertices.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start)->m_data + lVar14)[1] = 1.0;
      uVar2 = *puVar16;
      (gridAttributes.
       super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[lVar14 + -2] = uVar1;
      (gridAttributes.
       super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[lVar14 + -1] = uVar2;
      ((gridAttributes.
        super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14)[0] = 0x3f800000;
      ((gridAttributes.
        super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14)[1] = 0x3f800000;
      puVar16 = puVar16 + 1;
      lVar14 = lVar14 + 4;
    }
    lVar9 = lVar9 + 0x58;
  }
  puVar10 = indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start + 5;
  sVar11 = 0;
  for (lVar9 = 0; puVar13 = puVar10, lVar12 = -0x15, lVar9 != 0x15; lVar9 = lVar9 + 1) {
    for (; lVar12 != 0; lVar12 = lVar12 + 1) {
      sVar3 = (short)lVar12;
      uVar15 = sVar11 + sVar3 + 0x15;
      puVar13[-5] = uVar15;
      uVar17 = sVar11 + 0x2c + sVar3;
      puVar13[-4] = uVar17;
      puVar13[-3] = sVar11 + 0x2b + sVar3;
      puVar13[-2] = uVar15;
      puVar13[-1] = uVar17;
      *puVar13 = sVar11 + sVar3 + 0x16;
      puVar13 = puVar13 + 6;
    }
    puVar10 = puVar10 + 0x7e;
    sVar11 = sVar11 + 0x16;
  }
  local_1a0._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Drawing a grid with the shader. Setting a_attr for each vertex to (special, special, 1, 1)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar5 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar9 = CONCAT44(extraout_var,iVar5);
  uVar6 = (**(code **)(lVar9 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar7 = (**(code **)(lVar9 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_attr");
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    (**(code **)(lVar9 + 0x40))(0x8892,this->m_positionVboID);
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)gridVertices.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)gridVertices.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
               gridVertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x294);
    (**(code **)(lVar9 + 0x40))(0x8892,this->m_attribVboID);
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)gridAttributes.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)gridAttributes.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
               gridAttributes.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0x88e4);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x298);
    (**(code **)(lVar9 + 0x40))(0x8893,this->m_elementVboID);
    (**(code **)(lVar9 + 0x150))
              (0x8893,(long)indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,
               indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x29c);
  }
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  (**(code **)(lVar9 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar9 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  iVar5 = *(int *)&(this->super_RenderCase).field_0x84;
  if (iVar5 == 1) {
    (**(code **)(lVar9 + 0x19f0))
              (uVar6,4,0x1406,0,0,
               gridVertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    (**(code **)(lVar9 + 0x19f0))
              (uVar7,4,0x1406,0,0,
               gridAttributes.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (**(code **)(lVar9 + 0x610))(uVar6);
    (**(code **)(lVar9 + 0x610))(uVar7);
    (**(code **)(lVar9 + 0x568))
              (4,(ulong)((long)indices.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)indices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1,0x1403);
    (**(code **)(lVar9 + 0x518))(uVar6);
    (**(code **)(lVar9 + 0x518))(uVar7);
  }
  else if (iVar5 == 0) {
    (**(code **)(lVar9 + 0x40))(0x8892,this->m_positionVboID);
    (**(code **)(lVar9 + 0x19f0))(uVar6,4,0x1406,0,0,0);
    (**(code **)(lVar9 + 0x40))(0x8892,this->m_attribVboID);
    (**(code **)(lVar9 + 0x19f0))(uVar7,4,0x1406,0,0,0);
    (**(code **)(lVar9 + 0x610))(uVar6);
    (**(code **)(lVar9 + 0x610))(uVar7);
    (**(code **)(lVar9 + 0x568))
              (4,(ulong)((long)indices.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)indices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1,0x1403,0);
    (**(code **)(lVar9 + 0x518))(uVar6);
    (**(code **)(lVar9 + 0x518))(uVar7);
    (**(code **)(lVar9 + 0x40))(0x8892,0);
    (**(code **)(lVar9 + 0x40))(0x8893,0);
  }
  (**(code **)(lVar9 + 0x1680))(0);
  (**(code **)(lVar9 + 0x648))();
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"VertexAttributeCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x2c5);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1a0,&resultImage);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1a0);
  bVar4 = RenderCase::checkResultImage(&this->super_RenderCase,&resultImage);
  if (bVar4) {
    bVar4 = RenderCase::drawTestPattern(&this->super_RenderCase,false);
    testResult = (qpTestResult)!bVar4;
    description = "test pattern failed";
    if (bVar4) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&resultImage);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
  ~_Vector_base(&gridAttributes.
                 super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               );
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&gridVertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return STOP;
}

Assistant:

VertexAttributeCase::IterateResult VertexAttributeCase::iterate (void)
{
	// Create a [s_specialFloats] X [s_specialFloats] grid of vertices with each vertex having 2 [s_specialFloats] values
	// and calculate some basic operations with the floating point values. If all goes well, nothing special should happen

	std::vector<tcu::Vec4>	gridVertices	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<tcu::UVec4>	gridAttributes	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<deUint16>	indices			((DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const deUint32	one		= 0x3F800000;
		const float		posX	= (float)x / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) - 1] to [-1, 1]
		const float		posY	= (float)y / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f;

		gridVertices[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridAttributes[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::UVec4(s_specialFloats[x], s_specialFloats[y], one, one);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a grid with the shader. Setting a_attr for each vertex to (special, special, 1, 1)." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				attribLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");

		if (m_storage == STORAGE_BUFFER)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_positionVboID);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(gridVertices.size() * sizeof(tcu::Vec4)), &gridVertices[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribVboID);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(gridAttributes.size() * sizeof(tcu::UVec4)), &gridAttributes[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementVboID);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indices.size() * sizeof(deUint16)), &indices[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");
		}

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		if (m_storage == STORAGE_BUFFER)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_positionVboID);
			gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);

			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribVboID);
			gl.vertexAttribPointer(attribLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);

			gl.enableVertexAttribArray(positionLoc);
			gl.enableVertexAttribArray(attribLoc);
			gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, DE_NULL);
			gl.disableVertexAttribArray(positionLoc);
			gl.disableVertexAttribArray(attribLoc);

			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		else if (m_storage == STORAGE_CLIENT)
		{
			gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
			gl.vertexAttribPointer(attribLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridAttributes[0]);

			gl.enableVertexAttribArray(positionLoc);
			gl.enableVertexAttribArray(attribLoc);
			gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
			gl.disableVertexAttribArray(positionLoc);
			gl.disableVertexAttribArray(attribLoc);
		}
		else
			DE_ASSERT(false);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing still works
	if (!drawTestPattern(false))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}